

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O1

int scaling_list_data(GetBitContext *gb,ScalingList *sl,HEVCSPS *sps)

{
  uint8_t uVar1;
  byte bVar2;
  undefined2 uVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint uVar6;
  size_t __n;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  
  uVar15 = 0;
  do {
    uVar9 = 0x10 << ((char)uVar15 * '\x02' & 0x1fU);
    if (0x3f < uVar9) {
      uVar9 = 0x40;
    }
    __n = 0x40;
    if (uVar15 == 0) {
      __n = 0x10;
    }
    uVar13 = 0;
    do {
      uVar4 = gb->index;
      puVar5 = gb->buffer;
      uVar6 = gb->size_in_bits_plus8;
      uVar11 = uVar4 + (uVar4 < uVar6);
      uVar1 = puVar5[uVar4 >> 3];
      gb->index = uVar11;
      if ((char)(uVar1 << ((byte)uVar4 & 7)) < '\0') {
        iVar8 = 8;
        if (1 < uVar15) {
          uVar4 = *(uint *)(puVar5 + (uVar11 >> 3));
          uVar4 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18)
                  << ((byte)uVar11 & 7);
          if (uVar4 < 0x8000000) {
            uVar12 = uVar4 >> 0x10;
            if (0xffff >= uVar4) {
              uVar12 = uVar4;
            }
            iVar14 = (uint)(0xffff < uVar4) * 0x10;
            iVar8 = iVar14 + 8;
            uVar4 = uVar12 >> 8;
            if (uVar12 < 0x100) {
              iVar8 = iVar14;
              uVar4 = uVar12;
            }
            iVar8 = (uint)""[uVar4] + iVar8;
            uVar4 = (uVar11 - iVar8) + 0x1f;
            if (uVar6 < uVar4) {
              uVar4 = uVar6;
            }
            uVar11 = *(uint *)(puVar5 + (uVar4 >> 3));
            uVar11 = ((uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                      uVar11 << 0x18) << ((byte)uVar4 & 7)) >> ((byte)iVar8 & 0x1f);
            uVar4 = (uVar4 - iVar8) + 0x20;
            if (uVar6 < uVar4) {
              uVar4 = uVar6;
            }
            gb->index = uVar4;
            uVar4 = uVar11 & 1;
            iVar8 = (uVar11 >> 1 ^ -uVar4) + uVar4;
          }
          else {
            uVar12 = uVar11 + "\x13\x11\x0f\x0f\r\r\r\r\v\v\v\v\v\v\v\v\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                              [uVar4 >> 0x17];
            if (uVar6 < uVar11 + "\x13\x11\x0f\x0f\r\r\r\r\v\v\v\v\v\v\v\v\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                 [uVar4 >> 0x17]) {
              uVar12 = uVar6;
            }
            gb->index = uVar12;
            iVar8 = (int)se_golomb_vlc_code[uVar4 >> 0x17];
          }
          iVar8 = iVar8 + 8;
          sl->sl_dc[uVar15 - 2][uVar13] = (uint8_t)iVar8;
        }
        uVar10 = 0;
        do {
          if (uVar15 == 0) {
            lVar7 = (ulong)""[uVar10] << 2;
            puVar5 = "";
          }
          else {
            lVar7 = (ulong)""[uVar10] << 3;
            puVar5 = "";
          }
          bVar2 = puVar5[uVar10];
          uVar4 = gb->index;
          uVar6 = gb->size_in_bits_plus8;
          uVar11 = *(uint *)(gb->buffer + (uVar4 >> 3));
          uVar11 = (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18) << ((byte)uVar4 & 7);
          if (uVar11 < 0x8000000) {
            uVar12 = uVar11 >> 0x10;
            if (0xffff >= uVar11) {
              uVar12 = uVar11;
            }
            iVar16 = (uint)(0xffff < uVar11) * 0x10;
            iVar14 = iVar16 + 8;
            uVar11 = uVar12 >> 8;
            if (uVar12 < 0x100) {
              iVar14 = iVar16;
              uVar11 = uVar12;
            }
            iVar14 = (uint)""[uVar11] + iVar14;
            uVar4 = (uVar4 - iVar14) + 0x1f;
            if (uVar6 < uVar4) {
              uVar4 = uVar6;
            }
            uVar11 = *(uint *)(gb->buffer + (uVar4 >> 3));
            uVar11 = ((uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                      uVar11 << 0x18) << ((byte)uVar4 & 7)) >> ((byte)iVar14 & 0x1f);
            uVar4 = (uVar4 - iVar14) + 0x20;
            if (uVar6 < uVar4) {
              uVar4 = uVar6;
            }
            gb->index = uVar4;
            uVar4 = uVar11 & 1;
            iVar14 = (uVar11 >> 1 ^ -uVar4) + uVar4;
          }
          else {
            uVar12 = uVar4 + "\x13\x11\x0f\x0f\r\r\r\r\v\v\v\v\v\v\v\v\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                             [uVar11 >> 0x17];
            if (uVar6 < uVar4 + "\x13\x11\x0f\x0f\r\r\r\r\v\v\v\v\v\v\v\v\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                [uVar11 >> 0x17]) {
              uVar12 = uVar6;
            }
            gb->index = uVar12;
            iVar14 = (int)se_golomb_vlc_code[uVar11 >> 0x17];
          }
          uVar6 = iVar8 + iVar14 + 0x100;
          uVar4 = iVar8 + iVar14 + 0x1ff;
          if (-1 < (int)uVar6) {
            uVar4 = uVar6;
          }
          iVar8 = uVar6 - (uVar4 & 0xffffff00);
          sl->sl[uVar15][uVar13][lVar7 + (ulong)bVar2] = (uint8_t)iVar8;
          uVar10 = uVar10 + 1;
        } while (uVar9 + (uVar9 == 0) != uVar10);
      }
      else {
        uVar4 = get_ue_golomb_long(gb);
        if (uVar4 != 0) {
          if (uVar13 < uVar4) {
            fprintf(_stderr,"Invalid delta in scaling list data: %d.\n",(ulong)uVar4);
            return -1;
          }
          uVar4 = (int)uVar13 - uVar4;
          memcpy(sl->sl[uVar15] + uVar13,sl->sl[uVar15] + uVar4,__n);
          if (1 < uVar15) {
            sl->sl_dc[uVar15 - 2][uVar13] = sl->sl_dc[uVar15 - 2][uVar4];
          }
        }
      }
      uVar13 = uVar13 + (ulong)(uVar15 == 3) * 2 + 1;
    } while (uVar13 < 6);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  if (sps->chroma_format_idc == 3) {
    lVar7 = -0x40;
    do {
      uVar1 = sl->sl[2][3][lVar7];
      sl->sl[3][2][lVar7] = sl->sl[2][2][lVar7];
      sl->sl[3][3][lVar7] = uVar1;
      *(uint8_t *)((long)(sl->sl_dc + -0xb) + lVar7 + 2) = sl->sl[2][5][lVar7];
      sl->sl_dc[0][lVar7] = sl->sl[3][0][lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
    uVar3 = *(undefined2 *)(sl->sl_dc[0] + 4);
    *(undefined2 *)(sl->sl_dc[1] + 1) = *(undefined2 *)(sl->sl_dc[0] + 1);
    *(undefined2 *)(sl->sl_dc[1] + 4) = uVar3;
  }
  return 0;
}

Assistant:

static int scaling_list_data(GetBitContext *gb, ScalingList *sl, HEVCSPS *sps)
{
    uint8_t scaling_list_pred_mode_flag;
    int32_t scaling_list_dc_coef[2][6];
    int size_id, matrix_id, pos;
    int i;

    for (size_id = 0; size_id < 4; size_id++)
    {
        for (matrix_id = 0; matrix_id < 6; matrix_id += ((size_id == 3) ? 3 : 1))
        {
            scaling_list_pred_mode_flag = (uint8_t) get_bits1(gb);
            if (!scaling_list_pred_mode_flag)
            {
                unsigned int delta = get_ue_golomb_long(gb);
                /* Only need to handle non-zero delta. Zero means default,
                 * which should already be in the arrays. */
                if (delta)
                {
                    // Copy from previous array.
                    if (matrix_id < delta)
                    {
                        fprintf(stderr, "Invalid delta in scaling list data: %d.\n", delta);
                        return -1;
                    }
                    memcpy(sl->sl[size_id][matrix_id], sl->sl[size_id][matrix_id - delta], size_id > 0 ? 64 : 16);
                    if (size_id > 1)
                        sl->sl_dc[size_id - 2][matrix_id] = sl->sl_dc[size_id - 2][matrix_id - delta];
                }
            }
            else
            {
                int next_coef, coef_num;
                int32_t scaling_list_delta_coef;

                next_coef = 8;
                coef_num = FFMIN(64, 1 << (4 + (size_id << 1)));
                if (size_id > 1)
                {
                    scaling_list_dc_coef[size_id - 2][matrix_id] = get_se_golomb(gb) + 8;
                    next_coef = scaling_list_dc_coef[size_id - 2][matrix_id];
                    sl->sl_dc[size_id - 2][matrix_id] = (uint8_t)next_coef;
                }
                for (i = 0; i < coef_num; i++)
                {
                    if (size_id == 0)
                        pos = 4 * hevc_diag_scan4x4_y[i] + hevc_diag_scan4x4_x[i];
                    else
                        pos = 8 * hevc_diag_scan8x8_y[i] + hevc_diag_scan8x8_x[i];

                    scaling_list_delta_coef = get_se_golomb(gb);
                    next_coef = (next_coef + scaling_list_delta_coef + 256) % 256;
                    sl->sl[size_id][matrix_id][pos] = (uint8_t)next_coef;
                }
            }
        }
    }
    if (sps->chroma_format_idc == 3)
    {
        for (i = 0; i < 64; i++)
        {
            sl->sl[3][1][i] = sl->sl[2][1][i];
            sl->sl[3][2][i] = sl->sl[2][2][i];
            sl->sl[3][4][i] = sl->sl[2][4][i];
            sl->sl[3][5][i] = sl->sl[2][5][i];
        }
        sl->sl_dc[1][1] = sl->sl_dc[0][1];
        sl->sl_dc[1][2] = sl->sl_dc[0][2];
        sl->sl_dc[1][4] = sl->sl_dc[0][4];
        sl->sl_dc[1][5] = sl->sl_dc[0][5];
    }
    return 0;
}